

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_block_flush(BigBlock *block)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  uint checksum;
  uint r;
  uint s;
  int i;
  FILE *fheader;
  BigBlock *block_local;
  
  if (block->dirty == 0) {
LAB_00104bd9:
    if (block->attrset->dirty != 0) {
      iVar1 = attrset_write_attr_set_v2(block->attrset,block->basename);
      if (iVar1 != 0) {
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x264);
        goto LAB_00104c3e;
      }
      block->attrset->dirty = 0;
    }
    block_local._4_4_ = 0;
  }
  else {
    __stream = (FILE *)_big_file_open_a_file(block->basename,-1,"w+",1);
    if (__stream == (FILE *)0x0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x250);
    }
    else {
      iVar1 = fprintf(__stream,"DTYPE: %s\n",block);
      if (((-1 < iVar1) &&
          (iVar1 = fprintf(__stream,"NMEMB: %d\n",(ulong)(uint)block->nmemb), -1 < iVar1)) &&
         (iVar1 = fprintf(__stream,"NFILE: %d\n",(ulong)(uint)block->Nfile), -1 < iVar1)) {
        for (r = 0; (int)r < block->Nfile; r = r + 1) {
          uVar2 = (block->fchecksum[(int)r] & 0xffff) + (block->fchecksum[(int)r] >> 0x10);
          iVar1 = fprintf(__stream,"%06X: %td : %u : %u\n",(ulong)r,block->fsize[(int)r],
                          (ulong)block->fchecksum[(int)r],
                          (ulong)((uVar2 & 0xffff) + (uVar2 >> 0x10)));
          if (iVar1 < 0) {
            _big_file_raise("Writing file information to header",
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x25c);
            goto LAB_00104c33;
          }
        }
        fclose(__stream);
        block->dirty = 0;
        goto LAB_00104bd9;
      }
      _big_file_raise("Writing file header",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x256);
LAB_00104c33:
      fclose(__stream);
    }
LAB_00104c3e:
    block_local._4_4_ = -1;
  }
  return block_local._4_4_;
}

Assistant:

int
big_block_flush(BigBlock * block)
{
    FILE * fheader = NULL;
    if(block->dirty) {
        int i;
        fheader = _big_file_open_a_file(block->basename, FILEID_HEADER, "w+", 1);
        RAISEIF(fheader == NULL, ex_fileio, NULL);
        RAISEIF(
            (0 > fprintf(fheader, "DTYPE: %s\n", block->dtype)) ||
            (0 > fprintf(fheader, "NMEMB: %d\n", block->nmemb)) ||
            (0 > fprintf(fheader, "NFILE: %d\n", block->Nfile)),
                ex_fprintf,
                "Writing file header");
        for(i = 0; i < block->Nfile; i ++) {
            unsigned int s = block->fchecksum[i];
            unsigned int r = (s & 0xffff) + ((s & 0xffffffff) >> 16);
            unsigned int checksum = (r & 0xffff) + (r >> 16);
            RAISEIF(0 > fprintf(fheader, EXT_DATA ": %td : %u : %u\n", i, block->fsize[i], block->fchecksum[i], checksum),
                ex_fprintf, "Writing file information to header");
        }
        fclose(fheader);
        block->dirty = 0;
    }
    if(block->attrset->dirty) {
        RAISEIF(0 != attrset_write_attr_set_v2(block->attrset, block->basename),
            ex_write_attr,
            NULL);
        block->attrset->dirty = 0;
    }
    return 0;

ex_fprintf:
    fclose(fheader);
ex_write_attr:
ex_fileio:
    return -1;
}